

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type *addr;
  JavascriptEnumerator *pJVar1;
  Type TVar2;
  int iVar3;
  undefined4 extraout_var;
  JavascriptString *pJVar5;
  JavascriptString *unaff_R15;
  Type local_38;
  JavascriptString *pJVar4;
  
  addr = &this->currentEnumerator;
  do {
    pJVar1 = addr->ptr;
    if (pJVar1 == (JavascriptEnumerator *)0x0) {
      return (JavascriptString *)0x0;
    }
    iVar3 = (*(pJVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[99])(pJVar1,propertyId,attributes);
    pJVar4 = (JavascriptString *)CONCAT44(extraout_var,iVar3);
    pJVar5 = pJVar4;
    if (pJVar4 == (JavascriptString *)0x0) {
      if ((this->currentEnumerator).ptr == (this->prefixEnumerator).ptr) {
        pJVar1 = (this->arrayEnumerator).ptr;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = pJVar1;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      }
      else {
        local_38.ptr = (JavascriptEnumerator *)0x0;
      }
      TVar2.ptr = local_38.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = TVar2.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pJVar5 = unaff_R15;
    }
    unaff_R15 = pJVar5;
  } while (pJVar4 == (JavascriptString *)0x0);
  return pJVar5;
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        while (this->currentEnumerator)
        {
            JavascriptString * currentIndex = this->currentEnumerator->MoveAndGetNext(propertyId, attributes);
            if (currentIndex != nullptr)
            {
                return currentIndex;
            }
            this->currentEnumerator = (this->currentEnumerator == this->prefixEnumerator) ? this->arrayEnumerator : nullptr;
        }

        return nullptr;
    }